

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * CScriptNum::serialize(int64_t *value)

{
  long lVar1;
  ulong uVar2;
  byte *pbVar3;
  ulong *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  uint64_t absvalue;
  bool neg;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff98;
  ulong local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RSI == 0) {
    memset(in_RDI,0,0x18);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(in_stack_ffffffffffffff98);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(in_stack_ffffffffffffff98);
    uVar2 = *in_RSI;
    if ((long)uVar2 < 0) {
      local_30 = (*in_RSI ^ 0xffffffffffffffff) + 1;
    }
    else {
      local_30 = *in_RSI;
    }
    for (; local_30 != 0; local_30 = local_30 >> 8) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (in_stack_ffffffffffffff98,(value_type_conflict *)0x63c9dd);
    }
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                       (in_stack_ffffffffffffff98);
    if ((*pbVar3 & 0x80) == 0) {
      if ((long)uVar2 < 0) {
        pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                           (in_stack_ffffffffffffff98);
        *pbVar3 = *pbVar3 | 0x80;
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (in_stack_ffffffffffffff98,(value_type_conflict *)0x63ca41);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<unsigned char> serialize(const int64_t& value)
    {
        if(value == 0)
            return std::vector<unsigned char>();

        std::vector<unsigned char> result;
        const bool neg = value < 0;
        uint64_t absvalue = neg ? ~static_cast<uint64_t>(value) + 1 : static_cast<uint64_t>(value);

        while(absvalue)
        {
            result.push_back(absvalue & 0xff);
            absvalue >>= 8;
        }

//    - If the most significant byte is >= 0x80 and the value is positive, push a
//    new zero-byte to make the significant byte < 0x80 again.

//    - If the most significant byte is >= 0x80 and the value is negative, push a
//    new 0x80 byte that will be popped off when converting to an integral.

//    - If the most significant byte is < 0x80 and the value is negative, add
//    0x80 to it, since it will be subtracted and interpreted as a negative when
//    converting to an integral.

        if (result.back() & 0x80)
            result.push_back(neg ? 0x80 : 0);
        else if (neg)
            result.back() |= 0x80;

        return result;
    }